

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::VisibilityString(uint Visibility)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  StringRef SVar4;
  
  uVar3 = Visibility - 1;
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (uVar3 < 3) {
    pcVar1 = &DAT_00e75960 + *(int *)(&DAT_00e75960 + (ulong)uVar3 * 4);
    sVar2 = *(size_t *)(&DAT_00e75970 + (ulong)uVar3 * 8);
  }
  SVar4.Length = sVar2;
  SVar4.Data = pcVar1;
  return SVar4;
}

Assistant:

StringRef llvm::dwarf::VisibilityString(unsigned Visibility) {
  switch (Visibility) {
  case DW_VIS_local:
    return "DW_VIS_local";
  case DW_VIS_exported:
    return "DW_VIS_exported";
  case DW_VIS_qualified:
    return "DW_VIS_qualified";
  }
  return StringRef();
}